

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-util.c
# Opt level: O0

_Bool borg_sort_comp_hook(void *u,void *v,int a,int b)

{
  int iVar1;
  int cmp;
  int16_t *what;
  char **text;
  int b_local;
  int a_local;
  void *v_local;
  void *u_local;
  
  iVar1 = strcmp(*(char **)((long)u + (long)a * 8),*(char **)((long)u + (long)b * 8));
  if (iVar1 < 0) {
    u_local._7_1_ = true;
  }
  else if (iVar1 < 1) {
    u_local._7_1_ = *(short *)((long)v + (long)a * 2) <= *(short *)((long)v + (long)b * 2);
  }
  else {
    u_local._7_1_ = false;
  }
  return u_local._7_1_;
}

Assistant:

bool borg_sort_comp_hook(void *u, void *v, int a, int b)
{
    char   **text = (char **)(u);
    int16_t *what = (int16_t *)(v);

    int cmp;

    /* Compare the two strings */
    cmp = (strcmp(text[a], text[b]));

    /* Strictly less */
    if (cmp < 0)
        return true;

    /* Strictly more */
    if (cmp > 0)
        return false;

    /* Enforce "stable" sort */
    return (what[a] <= what[b]);
}